

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

uint8 * __thiscall UnifiedRegex::Compiler::Emit(Compiler *this,size_t size)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  uint8 *puVar7;
  uint uVar8;
  
  if (size >> 0x20 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x18,"(size <= (4294967295U))","size <= UINT32_MAX");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar1 = this->instLen;
  if (uVar1 - this->instNext < size) {
    uVar4 = (int)size - 1;
    uVar5 = uVar4 + uVar1;
    if ((CARRY4(uVar4,uVar1)) || ((int)uVar5 < 0)) {
      Js::Throw::OutOfMemory();
    }
    uVar4 = 0x80;
    if (0x80 < uVar1) {
      uVar4 = this->instLen;
    }
    do {
      uVar8 = uVar4;
      uVar4 = uVar8 * 2;
    } while (uVar8 <= uVar5);
    puVar7 = (uint8 *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      Realloc(&this->ctAllocator->
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                              ,this->instBuf,(ulong)uVar1,(ulong)uVar8);
    this->instBuf = puVar7;
    this->instLen = uVar8;
  }
  uVar1 = this->instNext;
  this->instNext = (int)size + uVar1;
  return this->instBuf + uVar1;
}

Assistant:

uint8* Compiler::Emit(size_t size)
    {
        Assert(size <= UINT32_MAX);

        if (instLen - instNext < size)
        {
            CharCount newLen = max(instLen, initInstBufSize);
            CharCount instLenPlus = (CharCount)(instLen + size - 1);

            // check for overflow
            if (instLenPlus < instLen || instLenPlus * 2 < instLenPlus)
            {
                Js::Throw::OutOfMemory();
            }

            while (newLen <= instLenPlus)
            {
                newLen *= 2;
            }

            instBuf = (uint8*)ctAllocator->Realloc(instBuf, instLen, newLen);
            instLen = newLen;
        }
        uint8* inst = instBuf + instNext;
        instNext += (CharCount)size;
        return inst;
    }